

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O1

int choosePlayerNumber(int minPlayers,int maxPlayers)

{
  undefined8 in_RAX;
  ostream *poVar1;
  int playerChoice;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  do {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"please choose a number of players between ",0x2a);
    poVar1 = (ostream *)std::ostream::operator<<(&std::cout,2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," and ",5);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,minPlayers);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," :\n",3);
    std::istream::operator>>((istream *)&std::cin,(int *)((long)&uStack_38 + 4));
    std::ios::clear((int)*(undefined8 *)(std::cin + -0x18) + 0x13e528);
    std::istream::ignore((long)&std::cin,0x200);
  } while (minPlayers < uStack_38._4_4_ || uStack_38._4_4_ < 2);
  return uStack_38._4_4_;
}

Assistant:

static int choosePlayerNumber(int minPlayers, int maxPlayers) {
    int playerChoice;
    do {
        cout << "please choose a number of players between " << minPlayers << " and " << maxPlayers << " :\n";
        cin >> playerChoice;
        cin.clear();
        cin.ignore(512, '\n');
    } while (playerChoice < minPlayers || playerChoice > maxPlayers || isnan(playerChoice));
    return int(playerChoice);
}